

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  seqDef *psVar1;
  int iVar2;
  bool bVar3;
  seqStore_t *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  BYTE *ip;
  uint uVar15;
  ulong uVar16;
  U32 UVar17;
  int *piVar18;
  size_t sVar19;
  ulong uVar20;
  size_t offsetFound;
  int *local_c8;
  size_t local_b0;
  BYTE *local_a8;
  int *local_a0;
  ulong local_98;
  ulong local_90;
  BYTE *local_88;
  ulong local_80;
  BYTE *local_78;
  uint local_6c;
  BYTE *local_68;
  ZSTD_matchState_t *local_60;
  ZSTD_compressionParameters *local_58;
  uint local_4c;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_a0 = (int *)((long)src + (srcSize - 8));
  local_78 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar6 = (ms->window).dictLimit;
  uVar20 = (ulong)uVar6;
  uVar16 = (ulong)(ms->window).lowLimit;
  local_a8 = local_78 + uVar20;
  uVar7 = *rep;
  uVar10 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  piVar14 = (int *)((ulong)(local_a8 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar14 < local_a0) {
    local_68 = pBVar11 + uVar20;
    local_38 = pBVar11 + uVar16;
    iVar5 = uVar6 - 1;
    local_98 = uVar16;
    local_90 = uVar20;
    local_88 = pBVar11;
    local_60 = ms;
    local_58 = cParams;
    local_48 = seqStore;
    do {
      uVar6 = (int)piVar14 - (int)local_78;
      local_80 = (ulong)uVar6;
      uVar6 = (uVar6 - uVar7) + 1;
      pBVar12 = local_78;
      if (uVar6 < (uint)uVar20) {
        pBVar12 = pBVar11;
      }
      local_6c = uVar10;
      if (((uint)uVar16 < uVar6 && 2 < iVar5 - uVar6) &&
         (*(int *)((long)piVar14 + 1) == *(int *)(pBVar12 + uVar6))) {
        pBVar11 = iEnd;
        if (uVar6 < (uint)uVar20) {
          pBVar11 = local_68;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar14 + 5),(BYTE *)((long)(pBVar12 + uVar6) + 4),iEnd,
                           pBVar11,local_a8);
        uVar20 = sVar8 + 4;
      }
      else {
        uVar20 = 0;
      }
      local_b0 = 99999999;
      sVar9 = ZSTD_BtFindBestMatch_selectMLS_extDict
                        (local_60,local_58,(BYTE *)piVar14,iEnd,&local_b0);
      sVar8 = uVar20;
      if (uVar20 < sVar9) {
        sVar8 = sVar9;
      }
      if (sVar8 < 4) {
        piVar14 = (int *)((long)piVar14 + ((long)piVar14 - (long)src >> 8) + 1);
        pBVar11 = local_88;
        uVar20 = local_90;
        uVar16 = local_98;
        piVar18 = local_a0;
        uVar10 = local_6c;
      }
      else {
        local_c8 = piVar14;
        sVar19 = local_b0;
        if (sVar9 <= uVar20) {
          local_c8 = (int *)((long)piVar14 + 1);
          sVar19 = 0;
        }
        uVar20 = local_80;
        local_4c = uVar7;
        if (piVar14 < local_a0) {
          do {
            piVar18 = (int *)((long)piVar14 + 1);
            uVar6 = (int)uVar20 + 1;
            local_80 = uVar20;
            if (sVar19 == 0) {
              sVar19 = 0;
            }
            else {
              uVar7 = uVar6 - uVar7;
              pBVar11 = local_78;
              if (uVar7 < (uint)local_90) {
                pBVar11 = local_88;
              }
              if (((uint)local_98 < uVar7 && 2 < iVar5 - uVar7) &&
                 (*piVar18 == *(int *)(pBVar11 + uVar7))) {
                pBVar12 = iEnd;
                if (uVar7 < (uint)local_90) {
                  pBVar12 = local_68;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar14 + 5),(BYTE *)((long)(pBVar11 + uVar7) + 4)
                                   ,iEnd,pBVar12,local_a8);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar10 = (int)sVar19 + 1;
                  uVar7 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)sVar8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    sVar19 = 0;
                    sVar8 = sVar9 + 4;
                    local_c8 = piVar18;
                  }
                }
              }
            }
            local_b0 = 99999999;
            sVar9 = ZSTD_BtFindBestMatch_selectMLS_extDict
                              (local_60,local_58,(BYTE *)piVar18,iEnd,&local_b0);
            uVar7 = local_4c;
            bVar3 = true;
            if (3 < sVar9) {
              uVar15 = (int)sVar19 + 1;
              uVar10 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar15 = (int)local_b0 + 1;
              iVar2 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)sVar8 * 4 + -0x1b) < (int)sVar9 * 4 - iVar2) {
                bVar3 = false;
                sVar19 = local_b0;
                sVar8 = sVar9;
                local_c8 = piVar18;
              }
            }
            if (bVar3) {
              if (local_a0 <= piVar18) break;
              piVar18 = (int *)((long)piVar14 + 2);
              uVar6 = (int)local_80 + 2;
              local_80 = (ulong)uVar6;
              if (sVar19 == 0) {
                sVar19 = 0;
              }
              else {
                uVar6 = uVar6 - local_4c;
                pBVar11 = local_78;
                if (uVar6 < (uint)local_90) {
                  pBVar11 = local_88;
                }
                if (((uint)local_98 < uVar6 && 2 < iVar5 - uVar6) &&
                   (*piVar18 == *(int *)(pBVar11 + uVar6))) {
                  pBVar12 = iEnd;
                  if (uVar6 < (uint)local_90) {
                    pBVar12 = local_68;
                  }
                  sVar9 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar14 + 6),
                                     (BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,pBVar12,local_a8);
                  if (sVar9 < 0xfffffffffffffffc) {
                    uVar10 = (int)sVar19 + 1;
                    uVar6 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                      }
                    }
                    if ((int)((uVar6 ^ 0x1f) + (int)sVar8 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                      sVar19 = 0;
                      sVar8 = sVar9 + 4;
                      local_c8 = piVar18;
                    }
                  }
                }
              }
              local_b0 = 99999999;
              sVar9 = ZSTD_BtFindBestMatch_selectMLS_extDict
                                (local_60,local_58,(BYTE *)piVar18,iEnd,&local_b0);
              bVar3 = true;
              if (3 < sVar9) {
                uVar10 = (int)sVar19 + 1;
                uVar6 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                uVar10 = (int)local_b0 + 1;
                iVar2 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)sVar8 * 4 + -0x18) < (int)sVar9 * 4 - iVar2) {
                  bVar3 = false;
                  sVar19 = local_b0;
                  sVar8 = sVar9;
                  local_c8 = piVar18;
                }
              }
              uVar20 = local_80;
              piVar14 = piVar18;
              if (bVar3) break;
            }
            else {
              uVar20 = (ulong)uVar6;
              piVar14 = piVar18;
            }
          } while (piVar14 < local_a0);
        }
        psVar4 = local_48;
        piVar18 = local_a0;
        if (sVar19 == 0) {
          UVar17 = 1;
          uVar6 = uVar7;
          uVar10 = local_6c;
        }
        else {
          pBVar13 = (BYTE *)((long)local_c8 + (2 - (long)(local_78 + sVar19)));
          pBVar12 = local_a8;
          pBVar11 = local_78;
          if ((uint)pBVar13 < (uint)local_90) {
            pBVar12 = local_38;
            pBVar11 = local_88;
          }
          if ((src < local_c8) && (uVar20 = (ulong)pBVar13 & 0xffffffff, pBVar12 < pBVar11 + uVar20)
             ) {
            pBVar11 = pBVar11 + uVar20;
            do {
              piVar14 = (int *)((long)local_c8 + -1);
              pBVar11 = pBVar11 + -1;
              if ((*(BYTE *)piVar14 != *pBVar11) ||
                 (sVar8 = sVar8 + 1, local_c8 = piVar14, piVar14 <= src)) break;
            } while (pBVar12 < pBVar11);
          }
          UVar17 = (int)sVar19 + 1;
          uVar6 = (int)sVar19 - 2;
          uVar10 = uVar7;
        }
        uVar20 = (long)local_c8 - (long)src;
        pBVar12 = local_48->lit;
        pBVar11 = pBVar12 + uVar20;
        do {
          *(undefined8 *)pBVar12 = *src;
          pBVar12 = pBVar12 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar12 < pBVar11);
        local_48->lit = local_48->lit + uVar20;
        if (0xffff < uVar20) {
          local_48->longLengthID = 1;
          local_48->longLengthPos =
               (U32)((ulong)((long)local_48->sequences - (long)local_48->sequencesStart) >> 3);
        }
        psVar1 = local_48->sequences;
        psVar1->litLength = (U16)uVar20;
        psVar1->offset = UVar17;
        if (0xffff < sVar8 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar1 - (long)local_48->sequencesStart) >> 3);
        }
        psVar1->matchLength = (U16)(sVar8 - 3);
        local_48->sequences = psVar1 + 1;
        piVar14 = (int *)((long)local_c8 + sVar8);
        src = piVar14;
        pBVar11 = local_88;
        uVar20 = local_90;
        uVar16 = local_98;
        do {
          uVar7 = uVar6;
          if (piVar18 < piVar14) break;
          uVar7 = (uint)((long)piVar14 - (long)(local_78 + uVar10));
          pBVar12 = local_78;
          if (uVar7 < (uint)uVar20) {
            pBVar12 = pBVar11;
          }
          if (((uint)uVar16 < uVar7 && 2 < iVar5 - uVar7) &&
             (*piVar14 ==
              *(int *)(pBVar12 + ((long)piVar14 - (long)(local_78 + uVar10) & 0xffffffff)))) {
            pBVar11 = iEnd;
            if (uVar7 < (uint)uVar20) {
              pBVar11 = local_68;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar14 + 1),
                               (BYTE *)((long)(pBVar12 +
                                              ((long)piVar14 - (long)(local_78 + uVar10) &
                                              0xffffffff)) + 4),iEnd,pBVar11,local_a8);
            *(undefined8 *)psVar4->lit = *src;
            psVar1 = psVar4->sequences;
            psVar1->litLength = 0;
            psVar1->offset = 1;
            if (0xffff < sVar8 + 1) {
              psVar4->longLengthID = 2;
              psVar4->longLengthPos =
                   (U32)((ulong)((long)psVar1 - (long)psVar4->sequencesStart) >> 3);
            }
            psVar1->matchLength = (U16)(sVar8 + 1);
            psVar4->sequences = psVar1 + 1;
            piVar14 = (int *)((long)piVar14 + sVar8 + 4);
            bVar3 = true;
            src = piVar14;
            pBVar11 = local_88;
            uVar20 = local_90;
            uVar16 = local_98;
            uVar7 = uVar6;
            uVar6 = uVar10;
          }
          else {
            bVar3 = false;
            uVar7 = uVar10;
          }
          uVar10 = uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
    } while (piVar14 < piVar18);
  }
  *local_40 = uVar7;
  local_40[1] = uVar10;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}